

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_237::FindingApplier::handleRefinement(FindingApplier *this,Expression *curr)

{
  long *plVar1;
  uintptr_t uVar2;
  long lVar3;
  Type type_;
  Function *pFVar4;
  undefined1 auVar5 [16];
  Expression *pEVar6;
  Index IVar7;
  iterator iVar8;
  long *plVar9;
  LocalSet *this_00;
  iterator __it;
  mapped_type *pmVar10;
  Type in_R8;
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  *this_01;
  Expression *local_58;
  Expression *curr_1;
  undefined8 local_48;
  BinaryLocation local_40;
  Expression *local_38;
  Expression *curr_local;
  
  local_38 = curr;
  iVar8 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->finder->lessCastedGets)._M_h,&local_38);
  if (iVar8.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (local_38->type).id;
    IVar7 = Builder::addVar((Builder *)
                            (this->
                            super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                            ).
                            super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
    pEVar6 = local_38;
    plVar9 = *(long **)((long)iVar8.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                              ._M_cur + 0x10);
    plVar1 = *(long **)((long)iVar8.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                              ._M_cur + 0x18);
    if (plVar9 != plVar1) {
      uVar2 = (local_38->type).id;
      do {
        lVar3 = *plVar9;
        *(Index *)(lVar3 + 0x10) = IVar7;
        *(uintptr_t *)(lVar3 + 8) = uVar2;
        plVar9 = plVar9 + 1;
      } while (plVar9 != plVar1);
    }
    type_.id = (local_38->type).id;
    this_00 = (LocalSet *)
              MixedArena::allocSpace
                        (&((this->
                           super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                           ).
                           super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                          .currModule)->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
    this_00->index = IVar7;
    this_00->value = pEVar6;
    LocalSet::makeTee(this_00,type_);
    pFVar4 = (this->
             super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
             .currFunction;
    if ((pFVar4 != (Function *)0x0) && ((pFVar4->debugLocations)._M_h._M_element_count != 0)) {
      this_01 = &pFVar4->debugLocations;
      local_58 = *(this->
                  super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                  ).
                  super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                  .replacep;
      curr_1 = (Expression *)this_00;
      __it = std::
             _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&this_01->_M_h,&local_58);
      if (__it.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
          ._M_cur != (__node_type *)0x0) {
        local_40 = *(BinaryLocation *)
                    ((long)__it.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                           ._M_cur + 0x18);
        local_48 = *(undefined8 *)
                    ((long)__it.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                           ._M_cur + 0x10);
        std::
        _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&this_01->_M_h,
                (const_iterator)
                __it.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                ._M_cur);
        pmVar10 = std::__detail::
                  _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_01,&curr_1);
        pmVar10->columnNumber = local_40;
        pmVar10->fileIndex = (undefined4)local_48;
        pmVar10->lineNumber = local_48._4_4_;
        this_00 = (LocalSet *)curr_1;
      }
    }
    *(this->
     super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
     ).
     super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
     .replacep = (Expression *)this_00;
  }
  return;
}

Assistant:

void handleRefinement(Expression* curr) {
    auto iter = finder.lessCastedGets.find(curr);
    if (iter == finder.lessCastedGets.end()) {
      return;
    }

    // This expression was the best cast for some gets. Add a new local to
    // store this value, then use it for the gets.
    auto var = Builder::addVar(getFunction(), curr->type);
    auto& gets = iter->second;
    for (auto* get : gets) {
      get->index = var;
      get->type = curr->type;
    }

    // Replace ourselves with a tee.
    replaceCurrent(Builder(*getModule()).makeLocalTee(var, curr, curr->type));
  }